

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitiveIntegers.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_primitiveInteger_unsigned_printString(sysbvm_context_t *context,uint64_t integer)

{
  undefined1 auVar1 [16];
  sysbvm_tuple_t sVar2;
  ulong local_68;
  uint64_t value;
  size_t bufferSize;
  char buffer [64];
  uint64_t integer_local;
  sysbvm_context_t *context_local;
  
  value = 0;
  buffer._56_8_ = integer;
  for (local_68 = integer; local_68 != 0 || value == 0; local_68 = local_68 / 10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_68;
    buffer[value - 8] = SUB161(auVar1 % ZEXT816(10),0) + '0';
    value = value + 1;
  }
  buffer[value - 8] = '\0';
  sVar2 = sysbvm_string_createWithReversedString(context,value,(char *)&bufferSize);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_primitiveInteger_unsigned_printString(sysbvm_context_t *context, uint64_t integer)
{
    char buffer[64];
    size_t bufferSize = 0;

    // Extract each one of the digits.
    uint64_t value = integer;
    while (value != 0 || bufferSize == 0)
    {
        buffer[bufferSize++] = '0' + (value % 10);
        value /= 10;
    }

    buffer[bufferSize] = 0;
    return sysbvm_string_createWithReversedString(context, bufferSize, buffer);
}